

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

const_reference __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::operator[](InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             *this,size_type i)

{
  ulong uVar1;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar2;
  anon_class_1_0_00000001 local_11;
  
  uVar1 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (uVar1 >> 1 <= i) {
    operator[]::anon_class_1_0_00000001::operator()(&local_11);
    uVar1 = (this->storage_).metadata_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
  }
  if ((uVar1 & 1) == 0) {
    pPVar2 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
             &(this->storage_).data_;
  }
  else {
    pPVar2 = (this->storage_).data_.allocated.allocated_data;
  }
  return pPVar2 + i;
}

Assistant:

const_reference operator[](size_type i) const ABSL_ATTRIBUTE_LIFETIME_BOUND {
    ABSL_HARDENING_ASSERT(i < size());
    return data()[i];
  }